

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ctl.c
# Opt level: O0

int gost_control_func(ENGINE *e,int cmd,long i,void *p,_func_void *f)

{
  uint uVar1;
  int in_ESI;
  int in_R8D;
  int ret;
  int param;
  undefined4 local_4;
  
  uVar1 = in_ESI - 200;
  if (((int)uVar1 < 0) || (3 < (int)uVar1)) {
    local_4 = -1;
  }
  else {
    local_4 = gost_set_default_param(in_R8D,(char *)((ulong)uVar1 << 0x20));
  }
  return local_4;
}

Assistant:

int gost_control_func(ENGINE *e, int cmd, long i, void *p, void (*f) (void))
{
    int param = cmd - ENGINE_CMD_BASE;
    int ret = 0;
    if (param < 0 || param > GOST_PARAM_MAX) {
        return -1;
    }
    ret = gost_set_default_param(param, p);
    return ret;
}